

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_64.c
# Opt level: O2

parasail_result_t *
parasail_sw_table_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  uint seglen;
  __m256i c;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i vH;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i vH_00;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  int iVar5;
  ulong uVar6;
  parasail_result_t *result;
  __m256i *palVar7;
  __m256i *ptr;
  __m256i *palVar8;
  __m256i *b_09;
  long lVar9;
  char *pcVar10;
  undefined4 in_register_00000014;
  ulong uVar11;
  uint uVar12;
  char *__format;
  __m256i *__return_storage_ptr__;
  int iVar13;
  __m256i *ptr_00;
  long lVar14;
  __m256i *palVar15;
  ulong uVar16;
  ulong size;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar23 [64];
  undefined8 in_stack_fffffffffffffe58;
  uint d;
  undefined4 uVar24;
  long lVar25;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 auVar22 [64];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar10 = "profile";
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar10 = "profile->profile64.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar10 = "profile->matrix";
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar10 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar10 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar10 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar10 = "open";
        }
        else {
          if (-1 < gap) {
            uVar6 = (ulong)ppVar4->max;
            result = parasail_result_new_table1((uint)((ulong)uVar2 + 3) & 0x7ffffffc,s2Len);
            if (result != (parasail_result_t *)0x0) {
              size = (ulong)uVar2 + 3 >> 2;
              result->flag = result->flag | 0x4820804;
              palVar7 = parasail_memalign___m256i(0x20,size);
              ptr = parasail_memalign___m256i(0x20,size);
              palVar8 = parasail_memalign___m256i(0x20,size);
              b_09 = parasail_memalign___m256i(0x20,size);
              uVar12 = 0;
              uVar24 = 0;
              if ((b_09 != (__m256i *)0x0 && palVar8 != (__m256i *)0x0) &&
                  (ptr != (__m256i *)0x0 && palVar7 != (__m256i *)0x0)) {
                auVar17._4_4_ = 0;
                auVar17._0_4_ = open;
                auVar17._8_4_ = open;
                auVar17._12_4_ = 0;
                auVar17._16_4_ = open;
                auVar17._20_4_ = 0;
                auVar17._24_4_ = open;
                auVar17._28_4_ = 0;
                auVar18._4_4_ = 0;
                auVar18._0_4_ = gap;
                auVar18._8_4_ = gap;
                auVar18._12_4_ = 0;
                auVar18._16_4_ = gap;
                auVar18._20_4_ = 0;
                auVar18._24_4_ = gap;
                auVar18._28_4_ = 0;
                lVar9 = ~uVar6 + 0x7fffffffffffffff;
                alVar1[1]._0_4_ = s2Len;
                alVar1[0] = in_stack_fffffffffffffe58;
                alVar1[1]._4_4_ = in_register_00000014;
                alVar1[2] = (longlong)result;
                alVar1[3] = 0;
                parasail_memset___m256i(palVar7,alVar1,size);
                c[1]._0_4_ = s2Len;
                c[0] = in_stack_fffffffffffffe58;
                c[1]._4_4_ = in_register_00000014;
                c[2] = (longlong)result;
                c[3]._0_4_ = uVar12;
                c[3]._4_4_ = uVar24;
                __return_storage_ptr__ = b_09;
                parasail_memset___m256i(b_09,c,size);
                seglen = (uint)size;
                uVar6 = (ulong)(uint)s2Len;
                auVar20._8_8_ = 0xc000000000000000;
                auVar20._0_8_ = 0xc000000000000000;
                auVar20._16_8_ = 0xc000000000000000;
                auVar20._24_8_ = 0xc000000000000000;
                auVar22 = ZEXT3264(auVar20);
                lVar25 = -0x4000000000000000;
                uVar16 = 0;
                do {
                  ptr_00 = palVar7;
                  d = s2Len;
                  if (uVar16 == uVar6) {
LAB_0076528c:
                    if (lVar25 == 0x7fffffffffffffff) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                    }
                    iVar5 = parasail_result_is_saturated(result);
                    palVar7 = palVar8;
                    if (iVar5 == 0) {
                      if (uVar12 == d - 2) {
                        palVar7 = ptr;
                      }
                      if (uVar12 == d - 1) {
                        palVar7 = ptr_00;
                        ptr_00 = palVar8;
                      }
                      iVar5 = uVar2 - 1;
                      for (uVar6 = 0; (seglen & 0x1fffffff) << 2 != (uint)uVar6; uVar6 = uVar6 + 1)
                      {
                        if (((*palVar7)[uVar6] == lVar25) &&
                           (iVar13 = ((uint)uVar6 & 3) * seglen + ((uint)(uVar6 >> 2) & 0x3fffffff),
                           iVar13 < iVar5)) {
                          iVar5 = iVar13;
                        }
                      }
                      if (uVar12 != d - 2) {
                        palVar8 = ptr;
                      }
                      if (uVar12 != d - 1) {
                        ptr = palVar8;
                      }
                      iVar13 = (int)lVar25;
                    }
                    else {
                      uVar12 = 0;
                      iVar13 = -1;
                      iVar5 = 0;
                    }
                    result->score = iVar13;
                    result->end_query = iVar5;
                    result->end_ref = uVar12;
                    parasail_free(b_09);
                    parasail_free(palVar7);
                    parasail_free(ptr);
                    parasail_free(ptr_00);
                    return result;
                  }
                  local_118 = auVar22._0_32_;
                  alVar1 = palVar7[seglen - 1];
                  auVar19 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,8);
                  iVar5 = ppVar4->mapper[(byte)s2[uVar16]];
                  d = (uint)uVar16;
                  ptr_00 = ptr;
                  if (uVar12 == d - 2) {
                    ptr_00 = palVar8;
                  }
                  auVar19 = vpalignr_avx2((undefined1  [32])alVar1,auVar19,8);
                  auVar23 = ZEXT1664((undefined1  [16])0x0);
                  lVar14 = 0;
                  for (uVar11 = 0; size != uVar11; uVar11 = uVar11 + 1) {
                    auVar19 = vpaddq_avx2(auVar19,*(undefined1 (*) [32])
                                                   ((long)pvVar3 +
                                                   lVar14 + (long)(int)(iVar5 * seglen) * 0x20));
                    auVar21 = *(undefined1 (*) [32])((long)*b_09 + lVar14);
                    a[1]._0_4_ = s2Len;
                    a[0] = in_stack_fffffffffffffe58;
                    a[1]._4_4_ = in_register_00000014;
                    a[2] = (longlong)result;
                    a[3]._0_4_ = uVar12;
                    a[3]._4_4_ = uVar24;
                    b[1] = lVar25;
                    b[0] = (longlong)palVar8;
                    b[2] = lVar9;
                    b[3] = (longlong)ptr;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a,b);
                    a_00[1]._0_4_ = s2Len;
                    a_00[0] = in_stack_fffffffffffffe58;
                    a_00[1]._4_4_ = in_register_00000014;
                    a_00[2] = (longlong)result;
                    a_00[3]._0_4_ = uVar12;
                    a_00[3]._4_4_ = uVar24;
                    b_00[1] = lVar25;
                    b_00[0] = (longlong)palVar8;
                    b_00[2] = lVar9;
                    b_00[3] = (longlong)ptr;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_00,b_00);
                    a_01[1]._0_4_ = s2Len;
                    a_01[0] = in_stack_fffffffffffffe58;
                    a_01[1]._4_4_ = in_register_00000014;
                    a_01[2] = (longlong)result;
                    a_01[3]._0_4_ = uVar12;
                    a_01[3]._4_4_ = uVar24;
                    b_01[1] = lVar25;
                    b_01[0] = (longlong)palVar8;
                    b_01[2] = lVar9;
                    b_01[3] = (longlong)ptr;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_01,b_01);
                    *(undefined1 (*) [32])((long)*ptr_00 + lVar14) = auVar19;
                    __return_storage_ptr__ = (__m256i *)((result->field_4).rowcols)->score_row;
                    vH[1]._0_4_ = s2Len;
                    vH[0] = in_stack_fffffffffffffe58;
                    vH[1]._4_4_ = in_register_00000014;
                    vH[2] = (longlong)result;
                    vH[3]._0_4_ = uVar12;
                    vH[3]._4_4_ = uVar24;
                    arr_store_si256((int *)__return_storage_ptr__,vH,(int32_t)uVar11,seglen,d,s2Len)
                    ;
                    local_138._0_8_ = auVar19._0_8_;
                    local_138._8_8_ = auVar19._8_8_;
                    local_138._16_8_ = auVar19._16_8_;
                    local_138._24_8_ = auVar19._24_8_;
                    a_02[1]._0_4_ = s2Len;
                    a_02[0] = in_stack_fffffffffffffe58;
                    a_02[1]._4_4_ = in_register_00000014;
                    a_02[2] = (longlong)result;
                    a_02[3]._0_4_ = uVar12;
                    a_02[3]._4_4_ = uVar24;
                    b_02[1] = lVar25;
                    b_02[0] = (longlong)palVar8;
                    b_02[2] = lVar9;
                    b_02[3] = (longlong)ptr;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_02,b_02);
                    local_118._8_8_ = local_138._8_8_;
                    local_118._0_8_ = local_138._0_8_;
                    local_118._16_8_ = local_138._16_8_;
                    local_118._24_8_ = local_138._24_8_;
                    vpsubq_avx2(auVar19,auVar17);
                    auVar19 = vpsubq_avx2(auVar21,auVar18);
                    a_03[1]._0_4_ = s2Len;
                    a_03[0] = in_stack_fffffffffffffe58;
                    a_03[1]._4_4_ = in_register_00000014;
                    a_03[2] = (longlong)result;
                    a_03[3]._0_4_ = uVar12;
                    a_03[3]._4_4_ = uVar24;
                    b_03[1] = lVar25;
                    b_03[0] = (longlong)palVar8;
                    b_03[2] = lVar9;
                    b_03[3] = (longlong)ptr;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_03,b_03);
                    *(undefined1 (*) [32])((long)*b_09 + lVar14) = auVar19;
                    auVar19 = vpsubq_avx2(auVar23._0_32_,auVar18);
                    a_04[1]._0_4_ = s2Len;
                    a_04[0] = in_stack_fffffffffffffe58;
                    a_04[1]._4_4_ = in_register_00000014;
                    a_04[2] = (longlong)result;
                    a_04[3]._0_4_ = uVar12;
                    a_04[3]._4_4_ = uVar24;
                    b_04[1] = lVar25;
                    b_04[0] = (longlong)palVar8;
                    b_04[2] = lVar9;
                    b_04[3] = (longlong)ptr;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_04,b_04);
                    auVar23 = ZEXT3264(auVar19);
                    auVar19 = *(undefined1 (*) [32])((long)*palVar7 + lVar14);
                    lVar14 = lVar14 + 0x20;
                  }
                  if (uVar12 == d - 2) {
                    palVar8 = ptr;
                  }
                  auVar22 = ZEXT3264(local_118);
                  for (iVar5 = 0; iVar5 != 4; iVar5 = iVar5 + 1) {
                    auVar21 = auVar23._0_32_;
                    auVar19 = vperm2i128_avx2(auVar21,auVar21,8);
                    auVar19 = vpalignr_avx2(auVar21,auVar19,8);
                    uVar11 = 0;
                    palVar15 = ptr_00;
                    while (auVar23 = ZEXT3264(auVar19), size != uVar11) {
                      local_138._0_8_ = (*palVar15)[0];
                      local_138._8_8_ = (*palVar15)[1];
                      local_138._16_8_ = (*palVar15)[2];
                      local_138._24_8_ = (*palVar15)[3];
                      a_05[1]._0_4_ = s2Len;
                      a_05[0] = in_stack_fffffffffffffe58;
                      a_05[1]._4_4_ = in_register_00000014;
                      a_05[2] = (longlong)result;
                      a_05[3]._0_4_ = uVar12;
                      a_05[3]._4_4_ = uVar24;
                      b_05[1] = lVar25;
                      b_05[0] = (longlong)palVar8;
                      b_05[2] = lVar9;
                      b_05[3] = (longlong)ptr;
                      _mm256_max_epi64_rpl(__return_storage_ptr__,a_05,b_05);
                      (*palVar15)[0] = local_138._0_8_;
                      (*palVar15)[1] = local_138._8_8_;
                      (*palVar15)[2] = local_138._16_8_;
                      (*palVar15)[3] = local_138._24_8_;
                      __return_storage_ptr__ = (__m256i *)((result->field_4).rowcols)->score_row;
                      vH_00[1]._0_4_ = s2Len;
                      vH_00[0] = in_stack_fffffffffffffe58;
                      vH_00[1]._4_4_ = in_register_00000014;
                      vH_00[2] = (longlong)result;
                      vH_00[3]._0_4_ = uVar12;
                      vH_00[3]._4_4_ = uVar24;
                      arr_store_si256((int *)__return_storage_ptr__,vH_00,(int32_t)uVar11,seglen,d,
                                      s2Len);
                      a_06[1]._0_4_ = s2Len;
                      a_06[0] = in_stack_fffffffffffffe58;
                      a_06[1]._4_4_ = in_register_00000014;
                      a_06[2] = (longlong)result;
                      a_06[3]._0_4_ = uVar12;
                      a_06[3]._4_4_ = uVar24;
                      b_06[1] = lVar25;
                      b_06[0] = (longlong)palVar8;
                      b_06[2] = lVar9;
                      b_06[3] = (longlong)ptr;
                      auVar21 = local_138;
                      _mm256_max_epi64_rpl(__return_storage_ptr__,a_06,b_06);
                      auVar22 = ZEXT3264(auVar21);
                      auVar21 = vpsubq_avx2(local_138,auVar17);
                      auVar19 = vpsubq_avx2(auVar19,auVar18);
                      auVar21 = vpcmpgtq_avx2(auVar19,auVar21);
                      uVar11 = uVar11 + 1;
                      palVar15 = palVar15 + 1;
                      if ((((auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           SUB321(auVar21 >> 0x7f,0) == '\0') && SUB321(auVar21 >> 0xbf,0) == '\0')
                          && -1 < auVar21[0x1f]) goto LAB_00765200;
                    }
                  }
LAB_00765200:
                  auVar21 = auVar22._0_32_;
                  auVar19 = vpcmpgtq_avx2(auVar21,auVar20);
                  if ((((auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       SUB321(auVar19 >> 0x7f,0) != '\0') || SUB321(auVar19 >> 0xbf,0) != '\0') ||
                      auVar19[0x1f] < '\0') {
                    vpermq_avx2(auVar21,0x44);
                    a_07[1]._0_4_ = s2Len;
                    a_07[0] = in_stack_fffffffffffffe58;
                    a_07[1]._4_4_ = in_register_00000014;
                    a_07[2] = (longlong)result;
                    a_07[3]._0_4_ = uVar12;
                    a_07[3]._4_4_ = uVar24;
                    b_07[1] = lVar25;
                    b_07[0] = (longlong)palVar8;
                    b_07[2] = lVar9;
                    b_07[3] = (longlong)ptr;
                    auVar20 = auVar21;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_07,b_07);
                    vpslldq_avx2(auVar20,8);
                    a_08[1]._0_4_ = s2Len;
                    a_08[0] = in_stack_fffffffffffffe58;
                    a_08[1]._4_4_ = in_register_00000014;
                    a_08[2] = (longlong)result;
                    a_08[3]._0_4_ = uVar12;
                    a_08[3]._4_4_ = uVar24;
                    b_08[1] = lVar25;
                    b_08[0] = (longlong)palVar8;
                    b_08[2] = lVar9;
                    b_08[3] = (longlong)ptr;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_08,b_08);
                    lVar25 = vpextrq_avx(auVar20._16_16_,1);
                    if (lVar9 < lVar25) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      ptr = palVar7;
                      goto LAB_0076528c;
                    }
                    auVar20 = vpermq_avx2(auVar20,0xff);
                    uVar24 = 0;
                    auVar22 = ZEXT3264(auVar21);
                    uVar12 = d;
                  }
                  uVar16 = uVar16 + 1;
                  ptr = palVar7;
                  palVar7 = ptr_00;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar10 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_table_striped_profile_avx2_256_64",pcVar10);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    __m256i vNegInf;
    int64_t score = 0;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int64_t maxp = 0;
    /*int64_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    vZero = _mm256_setzero_si256();
    vNegInf = _mm256_set1_epi64x_rpl(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT64_MAX - (int64_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT64_MAX : (int64_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad =  parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vZero, segLen);
    parasail_memset___m256i(pvE, _mm256_set1_epi64x_rpl(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 8);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi64_rpl(vH, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            vH = _mm256_max_epi64_rpl(vH, vZero);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_sub_epi64(vH, vGapO);
            vE = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 8);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
                vH = _mm256_sub_epi64(vH, vGapO);
                vF = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi64(vF, vH))) goto end;
                /*vF = _mm256_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi64(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi64_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi64x_rpl(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT64_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT64_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int64_t *t = (int64_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}